

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O0

void __thiscall HAXX_UNARY_OP::quaternion_unary_assign::test_method(quaternion_unary_assign *this)

{
  undefined8 uVar1;
  bool bVar2;
  quaternion<double> p;
  quaternion<double> q;
  basic_cstring<const_char> *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  undefined1 local_1f8 [40];
  undefined1 local_1d0 [16];
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  undefined1 local_190 [40];
  undefined1 local_168 [16];
  basic_cstring<const_char> local_158;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  undefined1 local_128 [40];
  undefined1 local_100 [16];
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0 [2];
  basic_cstring<const_char> local_c0;
  undefined1 local_b0 [40];
  undefined1 local_88 [16];
  basic_cstring<const_char> local_78;
  quaternion<double> local_68;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  quaternion<double> local_28;
  
  local_30 = 1.0;
  local_38 = 2.0;
  local_40 = 3.0;
  local_48 = 4.0;
  HAXX::quaternion<double>::quaternion(&local_28,&local_30,&local_38,&local_40,&local_48);
  local_68._M_real = local_28._M_real;
  local_68._M_imag_i = local_28._M_imag_i;
  local_68._M_imag_j = local_28._M_imag_j;
  local_68._M_imag_k = local_28._M_imag_k;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffcf0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_78,0x95,local_88);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcf8,(char (*) [1])in_stack_fffffffffffffcf0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_e0[0].m_end = (iterator)HAXX::quaternion<double>::real(&local_28);
    local_e0[0].m_begin = (iterator)HAXX::quaternion<double>::real(&local_68);
    in_stack_fffffffffffffcf8 = "p.real()";
    in_stack_fffffffffffffcf0 = local_e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_b0,&local_c0,0x95,1,2,&local_e0[0].m_end,"q.real()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1ad9f6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffcf0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f0,0x96,local_100);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcf8,(char (*) [1])in_stack_fffffffffffffcf0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_148.m_end = (iterator)HAXX::quaternion<double>::imag_i(&local_28);
    local_148.m_begin = (iterator)HAXX::quaternion<double>::imag_i(&local_68);
    in_stack_fffffffffffffcf8 = "p.imag_i()";
    in_stack_fffffffffffffcf0 = &local_148;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_128,&local_138,0x96,1,2,&local_148.m_end,"q.imag_i()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1adb6b);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffcf0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_158,0x97,local_168);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcf8,(char (*) [1])in_stack_fffffffffffffcf0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_1b0.m_end = (iterator)HAXX::quaternion<double>::imag_j(&local_28);
    local_1b0.m_begin = (iterator)HAXX::quaternion<double>::imag_j(&local_68);
    in_stack_fffffffffffffcf8 = "p.imag_j()";
    in_stack_fffffffffffffcf0 = &local_1b0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_190,&local_1a0,0x97,1,2,&local_1b0.m_end,"q.imag_j()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1adcc2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffcf0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1c0,0x98,local_1d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcf8,(char (*) [1])in_stack_fffffffffffffcf0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx"
               ,0x5f);
    local_218.m_end = (iterator)HAXX::quaternion<double>::imag_k(&local_28);
    local_218.m_begin = (iterator)HAXX::quaternion<double>::imag_k(&local_68);
    in_stack_fffffffffffffcf8 = "p.imag_k()";
    in_stack_fffffffffffffcf0 = &local_218;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_1f8,&local_208,0x98,1,2,&local_218.m_end,"q.imag_k()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1ade0d);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_unary_assign)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.), p = q;

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),p.real());
  BOOST_CHECK_EQUAL(q.imag_i(),p.imag_i());
  BOOST_CHECK_EQUAL(q.imag_j(),p.imag_j());
  BOOST_CHECK_EQUAL(q.imag_k(),p.imag_k());

}